

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imageadapterbase.h
# Opt level: O2

void __thiscall bgui::ImageAdapterBase::ImageAdapterBase(ImageAdapterBase *this)

{
  this->_vptr_ImageAdapterBase = (_func_int **)&PTR__ImageAdapterBase_00122848;
  gmath::SMatrix<long,_2,_3>::SMatrix(&this->R);
  this->channel = -1;
  this->rotation = 0;
  this->flip = false;
  this->scale = 1.0;
  this->imin = 0.0;
  this->imax = 255.0;
  this->gamma = 1.0;
  this->map = map_raw;
  return;
}

Assistant:

ImageAdapterBase()
    {
      channel=-1;
      rotation=0;
      flip=false;
      scale=1;
      imin=0;
      imax=255;
      gamma=1;
      map=map_raw;
    }